

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaf2c.c
# Opt level: O0

void ga_f2c_get_cmd_args(int *argc,char ***argv)

{
  char *pcVar1;
  undefined8 *in_RSI;
  int *in_RDI;
  char cstring [255];
  char fstring [255];
  char **iargv;
  int iargc;
  Integer i;
  char acStack_228 [256];
  char local_128 [256];
  void *local_28;
  int local_1c;
  long local_18;
  undefined8 *local_10;
  int *local_8;
  
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_1c = f2c_iargc_();
  local_28 = (void *)0x0;
  if (0xff < local_1c) {
    printf("ga_f2c_get_cmd_args: too many cmd line args");
    armci_msg_abort(0);
  }
  local_28 = malloc(0x7f8);
  if (local_28 == (void *)0x0) {
    printf("ga_f2c_get_cmd_args: malloc iargv failed");
    armci_msg_abort(0);
  }
  for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
    f2c_getarg_(&local_18,local_128,0xff);
    ga_f2cstring(local_128,0xff,acStack_228,0xff);
    pcVar1 = strdup(acStack_228);
    *(char **)((long)local_28 + local_18 * 8) = pcVar1;
  }
  *local_8 = local_1c;
  *local_10 = local_28;
  *(undefined8 *)((long)local_28 + (long)local_1c * 8) = 0;
  return;
}

Assistant:

void ga_f2c_get_cmd_args(int *argc, char ***argv)
{
    Integer i=0;
    int iargc=F2C_IARGC();
    char **iargv=NULL;

    if (iargc > F2C_GETARG_ARGV_MAX) {
        printf("ga_f2c_get_cmd_args: too many cmd line args");
        armci_msg_abort(1);
    }
    iargv = (char**)malloc(sizeof(char*)*F2C_GETARG_ARGV_MAX);
    if (!iargv) {
        printf("ga_f2c_get_cmd_args: malloc iargv failed");
        armci_msg_abort(1);
    }
    for (i=0; i<iargc; i++) {
        char fstring[F2C_GETARG_ARGLEN_MAX];
        char cstring[F2C_GETARG_ARGLEN_MAX];
        F2C_GETARG(&i, fstring, F2C_GETARG_ARGLEN_MAX);
        ga_f2cstring(fstring, F2C_GETARG_ARGLEN_MAX,
                cstring, F2C_GETARG_ARGLEN_MAX);
        iargv[i] = strdup(cstring);
    }
    *argc = iargc;
    *argv = iargv;
    iargv[iargc] = 0;
}